

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O2

int loader_C(lua_State *L)

{
  char *name;
  char *path;
  char *sym;
  
  name = luaL_checklstring(L,1,(size_t *)0x0);
  path = findfile(L,name,"cpath");
  if (path != (char *)0x0) {
    mkfuncname(L,name);
    ll_loadfunc(L,path,sym);
    loaderror(L,path);
  }
  return 1;
}

Assistant:

static int loader_C (lua_State *L) {
  const char *funcname;
  const char *name = luaL_checkstring(L, 1);
  const char *filename = findfile(L, name, "cpath");
  if (filename == NULL) return 1;  /* library not found in this path */
  funcname = mkfuncname(L, name);
  if (ll_loadfunc(L, filename, funcname) != 0)
    loaderror(L, filename);
  return 1;  /* library loaded successfully */
}